

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O2

int __thiscall
ut::setup_impl<agge::tests::PathJoningTests>::init
          (setup_impl<agge::tests::PathJoningTests> *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  code *pcVar1;
  ulong *puVar2;
  
  for (puVar2 = (this->_inits).
                super__Vector_base<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->_inits).
                super__Vector_base<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 2) {
    pcVar1 = (code *)*puVar2;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)(ctx + puVar2[1]) + -1);
    }
    in_EAX = (*pcVar1)();
  }
  return in_EAX;
}

Assistant:

inline void setup_impl<Fixture>::init(Fixture &fixture) const
	{
		for (typename methods_list_t::const_iterator i = _inits.begin(); i != _inits.end(); ++i)
			(fixture.**i)();
	}